

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ParseUri(char *zDefaultVfs,char *zUri,uint *pFlags,sqlite3_vfs **ppVfs,char **pzFile,
                   char **pzErrMsg)

{
  char cVar1;
  char *__s2;
  long lVar2;
  char *pcVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  sqlite3_vfs *psVar10;
  long *in_RCX;
  uint *in_RDX;
  void *in_RSI;
  char *in_RDI;
  long *in_R8;
  undefined8 *in_R9;
  char *z;
  int mode;
  int i;
  int limit;
  int mask;
  char *zModeType;
  OpenMode *aMode;
  int nVal;
  char *zVal;
  int nOpt;
  int octet;
  u64 nByte;
  int iOut;
  int iIn;
  int eState;
  char *zOpt;
  int nUri;
  char c;
  char *zFile;
  char *zVfs;
  uint flags;
  int rc;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  uint in_stack_ffffffffffffff38;
  uint uVar11;
  undefined1 in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff3d;
  bool bVar12;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  uint local_b8;
  int local_b4;
  uint local_b0;
  uint local_ac;
  char *local_a8;
  OpenMode *local_a0;
  int local_74;
  int local_70;
  int local_6c;
  int *local_68;
  char local_51;
  void *local_50;
  char *local_48;
  uint local_40;
  uint local_3c;
  
  local_40 = *in_RDX;
  iVar6 = sqlite3Strlen30((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_48 = in_RDI;
  if (((((local_40 & 0x40) == 0) && (sqlite3Config.bOpenUri == '\0')) || (iVar6 < 5)) ||
     (iVar7 = memcmp(in_RSI,"file:",5), iVar7 != 0)) {
    local_50 = sqlite3_malloc64(CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (local_50 == (void *)0x0) {
      return 7;
    }
    memset(local_50,0,4);
    local_50 = (void *)((long)local_50 + 4);
    if (iVar6 != 0) {
      memcpy(local_50,in_RSI,(long)iVar6);
    }
    memset((void *)((long)local_50 + (long)iVar6),0,4);
    local_40 = local_40 & 0xffffffbf;
  }
  else {
    local_74 = 0;
    local_40 = local_40 | 0x40;
    for (local_70 = 0; local_70 < iVar6; local_70 = local_70 + 1) {
    }
    local_50 = sqlite3_malloc64(CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (local_50 == (void *)0x0) {
      return 7;
    }
    memset(local_50,0,4);
    local_50 = (void *)((long)local_50 + 4);
    local_70 = 5;
    if ((*(char *)((long)in_RSI + 5) == '/') && (*(char *)((long)in_RSI + 6) == '/')) {
      local_70 = 7;
      while( true ) {
        in_stack_ffffffffffffff3f = false;
        if (*(char *)((long)in_RSI + (long)local_70) != '\0') {
          in_stack_ffffffffffffff3f = *(char *)((long)in_RSI + (long)local_70) != '/';
        }
        if ((bool)in_stack_ffffffffffffff3f == false) break;
        local_70 = local_70 + 1;
      }
      if ((local_70 != 7) &&
         ((local_70 != 0x10 ||
          (iVar6 = memcmp("localhost",(void *)((long)in_RSI + 7),9), iVar6 != 0)))) {
        pcVar9 = sqlite3_mprintf("invalid uri authority: %.*s",(ulong)(local_70 - 7),
                                 (long)in_RSI + 7);
        *in_R9 = pcVar9;
        local_3c = 1;
        goto LAB_00220a53;
      }
    }
    local_6c = 0;
    while( true ) {
      local_51 = *(char *)((long)in_RSI + (long)local_70);
      in_stack_ffffffffffffff3e = local_51 != '\0' && local_51 != '#';
      if (local_51 == '\0' || local_51 == '#') break;
      iVar6 = local_70 + 1;
      if (((local_51 == '%') && ((""[*(byte *)((long)in_RSI + (long)iVar6)] & 8) != 0)) &&
         ((""[*(byte *)((long)in_RSI + (long)(local_70 + 2))] & 8) != 0)) {
        iVar7 = local_70 + 2;
        bVar4 = sqlite3HexToInt((int)*(char *)((long)in_RSI + (long)iVar6));
        local_70 = local_70 + 3;
        bVar5 = sqlite3HexToInt((int)*(char *)((long)in_RSI + (long)iVar7));
        iVar6 = (uint)bVar5 + (uint)bVar4 * 0x10;
        if (iVar6 == 0) {
          while( true ) {
            cVar1 = *(char *)((long)in_RSI + (long)local_70);
            bVar12 = false;
            if ((((cVar1 != '\0') && (bVar12 = false, cVar1 != '#')) &&
                ((local_6c != 0 || (bVar12 = false, cVar1 != '?')))) &&
               ((local_6c != 1 || ((bVar12 = false, cVar1 != '=' && (bVar12 = false, cVar1 != '&')))
                ))) {
              in_stack_ffffffffffffff3c = local_6c != 2 || cVar1 != '&';
              bVar12 = (bool)in_stack_ffffffffffffff3c;
            }
            if (!bVar12) break;
            local_70 = local_70 + 1;
          }
          in_stack_ffffffffffffff3d = 0;
        }
        else {
          local_51 = (char)iVar6;
LAB_0022060a:
          *(char *)((long)local_50 + (long)local_74) = local_51;
          local_74 = local_74 + 1;
        }
      }
      else {
        local_70 = iVar6;
        if ((local_6c != 1) || ((local_51 != '&' && (local_51 != '=')))) {
          if (((local_6c == 0) && (local_51 == '?')) || ((local_6c == 2 && (local_51 == '&')))) {
            local_51 = '\0';
            local_6c = 1;
          }
          goto LAB_0022060a;
        }
        if (*(char *)((long)local_50 + (long)(local_74 + -1)) != '\0') {
          if (local_51 == '&') {
            *(undefined1 *)((long)local_50 + (long)local_74) = 0;
            local_74 = local_74 + 1;
          }
          else {
            local_6c = 2;
          }
          local_51 = '\0';
          goto LAB_0022060a;
        }
        while( true ) {
          uVar11 = in_stack_ffffffffffffff38 & 0xffffff;
          if ((*(char *)((long)in_RSI + (long)local_70) != '\0') &&
             (uVar11 = in_stack_ffffffffffffff38 & 0xffffff,
             *(char *)((long)in_RSI + (long)local_70) != '#')) {
            uVar11 = CONCAT13(*(char *)((long)in_RSI + (long)(local_70 + -1)) != '&',
                              (int3)in_stack_ffffffffffffff38);
          }
          in_stack_ffffffffffffff38 = uVar11;
          if ((char)(uVar11 >> 0x18) == '\0') break;
          local_70 = local_70 + 1;
        }
      }
    }
    if (local_6c == 1) {
      *(undefined1 *)((long)local_50 + (long)local_74) = 0;
      local_74 = local_74 + 1;
    }
    memset((void *)((long)local_50 + (long)local_74),0,4);
    iVar6 = sqlite3Strlen30((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    local_68 = (int *)((long)local_50 + (long)(iVar6 + 1));
    while ((char)*local_68 != '\0') {
      iVar6 = sqlite3Strlen30((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))
      ;
      pcVar9 = (char *)((long)local_68 + (long)(iVar6 + 1));
      iVar7 = sqlite3Strlen30((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))
      ;
      if ((iVar6 != 3) || (iVar8 = memcmp("vfs",local_68,3), pcVar3 = pcVar9, iVar8 != 0)) {
        local_a0 = (OpenMode *)0x0;
        local_a8 = (char *)0x0;
        local_ac = 0;
        local_b0 = 0;
        if ((iVar6 == 5) && (iVar8 = memcmp("cache",local_68,5), iVar8 == 0)) {
          local_ac = 0x60000;
          local_a0 = sqlite3ParseUri::aCacheMode;
          local_b0 = 0x60000;
          local_a8 = "cache";
        }
        if ((iVar6 == 4) && (*local_68 == 0x65646f6d)) {
          local_ac = 0x87;
          local_a0 = sqlite3ParseUri::aOpenMode;
          local_b0 = local_40 & 0x87;
          local_a8 = "access";
        }
        pcVar3 = local_48;
        if (local_a0 != (OpenMode *)0x0) {
          local_b8 = 0;
          local_b4 = 0;
          while (local_a0[local_b4].z != (char *)0x0) {
            __s2 = local_a0[local_b4].z;
            in_stack_ffffffffffffff2c = iVar7;
            iVar6 = sqlite3Strlen30((char *)CONCAT44(iVar7,in_stack_ffffffffffffff28));
            if ((in_stack_ffffffffffffff2c == iVar6) &&
               (iVar6 = memcmp(pcVar9,__s2,(long)iVar7), iVar6 == 0)) {
              local_b8 = local_a0[local_b4].mode;
              break;
            }
            local_b4 = local_b4 + 1;
          }
          if (local_b8 == 0) {
            pcVar9 = sqlite3_mprintf("no such %s mode: %s",local_a8,pcVar9);
            *in_R9 = pcVar9;
            local_3c = 1;
            goto LAB_00220a53;
          }
          if ((int)local_b0 < (int)(local_b8 & 0xffffff7f)) {
            pcVar9 = sqlite3_mprintf("%s mode not allowed: %s",local_a8,pcVar9);
            *in_R9 = pcVar9;
            local_3c = 3;
            goto LAB_00220a53;
          }
          local_40 = local_40 & (local_ac ^ 0xffffffff) | local_b8;
        }
      }
      local_48 = pcVar3;
      local_68 = (int *)(pcVar9 + (iVar7 + 1));
    }
  }
  psVar10 = sqlite3_vfs_find((char *)CONCAT17(in_stack_ffffffffffffff3f,
                                              CONCAT16(in_stack_ffffffffffffff3e,
                                                       CONCAT15(in_stack_ffffffffffffff3d,
                                                                CONCAT14(in_stack_ffffffffffffff3c,
                                                                         in_stack_ffffffffffffff38))
                                                      )));
  *in_RCX = (long)psVar10;
  lVar2 = *in_RCX;
  if (lVar2 == 0) {
    pcVar9 = sqlite3_mprintf("no such vfs: %s",local_48);
    *in_R9 = pcVar9;
  }
  local_3c = (uint)(lVar2 == 0);
LAB_00220a53:
  if (local_3c != 0) {
    sqlite3_free_filename((char *)0x220a6a);
    local_50 = (void *)0x0;
  }
  *in_RDX = local_40;
  *in_R8 = (long)local_50;
  return local_3c;
}

Assistant:

SQLITE_PRIVATE int sqlite3ParseUri(
  const char *zDefaultVfs,        /* VFS to use if no "vfs=xxx" query option */
  const char *zUri,               /* Nul-terminated URI to parse */
  unsigned int *pFlags,           /* IN/OUT: SQLITE_OPEN_XXX flags */
  sqlite3_vfs **ppVfs,            /* OUT: VFS to use */
  char **pzFile,                  /* OUT: Filename component of URI */
  char **pzErrMsg                 /* OUT: Error message (if rc!=SQLITE_OK) */
){
  int rc = SQLITE_OK;
  unsigned int flags = *pFlags;
  const char *zVfs = zDefaultVfs;
  char *zFile;
  char c;
  int nUri = sqlite3Strlen30(zUri);

  assert( *pzErrMsg==0 );

  if( ((flags & SQLITE_OPEN_URI)                     /* IMP: R-48725-32206 */
       || AtomicLoad(&sqlite3GlobalConfig.bOpenUri)) /* IMP: R-51689-46548 */
   && nUri>=5 && memcmp(zUri, "file:", 5)==0         /* IMP: R-57884-37496 */
  ){
    char *zOpt;
    int eState;                   /* Parser state when parsing URI */
    int iIn;                      /* Input character index */
    int iOut = 0;                 /* Output character index */
    u64 nByte = nUri+8;           /* Bytes of space to allocate */

    /* Make sure the SQLITE_OPEN_URI flag is set to indicate to the VFS xOpen
    ** method that there may be extra parameters following the file-name.  */
    flags |= SQLITE_OPEN_URI;

    for(iIn=0; iIn<nUri; iIn++) nByte += (zUri[iIn]=='&');
    zFile = sqlite3_malloc64(nByte);
    if( !zFile ) return SQLITE_NOMEM_BKPT;

    memset(zFile, 0, 4);  /* 4-byte of 0x00 is the start of DB name marker */
    zFile += 4;

    iIn = 5;
#ifdef SQLITE_ALLOW_URI_AUTHORITY
    if( strncmp(zUri+5, "///", 3)==0 ){
      iIn = 7;
      /* The following condition causes URIs with five leading / characters
      ** like file://///host/path to be converted into UNCs like //host/path.
      ** The correct URI for that UNC has only two or four leading / characters
      ** file://host/path or file:////host/path.  But 5 leading slashes is a
      ** common error, we are told, so we handle it as a special case. */
      if( strncmp(zUri+7, "///", 3)==0 ){ iIn++; }
    }else if( strncmp(zUri+5, "//localhost/", 12)==0 ){
      iIn = 16;
    }
#else
    /* Discard the scheme and authority segments of the URI. */
    if( zUri[5]=='/' && zUri[6]=='/' ){
      iIn = 7;
      while( zUri[iIn] && zUri[iIn]!='/' ) iIn++;
      if( iIn!=7 && (iIn!=16 || memcmp("localhost", &zUri[7], 9)) ){
        *pzErrMsg = sqlite3_mprintf("invalid uri authority: %.*s",
            iIn-7, &zUri[7]);
        rc = SQLITE_ERROR;
        goto parse_uri_out;
      }
    }
#endif

    /* Copy the filename and any query parameters into the zFile buffer.
    ** Decode %HH escape codes along the way.
    **
    ** Within this loop, variable eState may be set to 0, 1 or 2, depending
    ** on the parsing context. As follows:
    **
    **   0: Parsing file-name.
    **   1: Parsing name section of a name=value query parameter.
    **   2: Parsing value section of a name=value query parameter.
    */
    eState = 0;
    while( (c = zUri[iIn])!=0 && c!='#' ){
      iIn++;
      if( c=='%'
       && sqlite3Isxdigit(zUri[iIn])
       && sqlite3Isxdigit(zUri[iIn+1])
      ){
        int octet = (sqlite3HexToInt(zUri[iIn++]) << 4);
        octet += sqlite3HexToInt(zUri[iIn++]);

        assert( octet>=0 && octet<256 );
        if( octet==0 ){
#ifndef SQLITE_ENABLE_URI_00_ERROR
          /* This branch is taken when "%00" appears within the URI. In this
          ** case we ignore all text in the remainder of the path, name or
          ** value currently being parsed. So ignore the current character
          ** and skip to the next "?", "=" or "&", as appropriate. */
          while( (c = zUri[iIn])!=0 && c!='#'
              && (eState!=0 || c!='?')
              && (eState!=1 || (c!='=' && c!='&'))
              && (eState!=2 || c!='&')
          ){
            iIn++;
          }
          continue;
#else
          /* If ENABLE_URI_00_ERROR is defined, "%00" in a URI is an error. */
          *pzErrMsg = sqlite3_mprintf("unexpected %%00 in uri");
          rc = SQLITE_ERROR;
          goto parse_uri_out;
#endif
        }
        c = octet;
      }else if( eState==1 && (c=='&' || c=='=') ){
        if( zFile[iOut-1]==0 ){
          /* An empty option name. Ignore this option altogether. */
          while( zUri[iIn] && zUri[iIn]!='#' && zUri[iIn-1]!='&' ) iIn++;
          continue;
        }
        if( c=='&' ){
          zFile[iOut++] = '\0';
        }else{
          eState = 2;
        }
        c = 0;
      }else if( (eState==0 && c=='?') || (eState==2 && c=='&') ){
        c = 0;
        eState = 1;
      }
      zFile[iOut++] = c;
    }
    if( eState==1 ) zFile[iOut++] = '\0';
    memset(zFile+iOut, 0, 4); /* end-of-options + empty journal filenames */

    /* Check if there were any options specified that should be interpreted
    ** here. Options that are interpreted here include "vfs" and those that
    ** correspond to flags that may be passed to the sqlite3_open_v2()
    ** method. */
    zOpt = &zFile[sqlite3Strlen30(zFile)+1];
    while( zOpt[0] ){
      int nOpt = sqlite3Strlen30(zOpt);
      char *zVal = &zOpt[nOpt+1];
      int nVal = sqlite3Strlen30(zVal);

      if( nOpt==3 && memcmp("vfs", zOpt, 3)==0 ){
        zVfs = zVal;
      }else{
        struct OpenMode {
          const char *z;
          int mode;
        } *aMode = 0;
        char *zModeType = 0;
        int mask = 0;
        int limit = 0;

        if( nOpt==5 && memcmp("cache", zOpt, 5)==0 ){
          static struct OpenMode aCacheMode[] = {
            { "shared",  SQLITE_OPEN_SHAREDCACHE },
            { "private", SQLITE_OPEN_PRIVATECACHE },
            { 0, 0 }
          };

          mask = SQLITE_OPEN_SHAREDCACHE|SQLITE_OPEN_PRIVATECACHE;
          aMode = aCacheMode;
          limit = mask;
          zModeType = "cache";
        }
        if( nOpt==4 && memcmp("mode", zOpt, 4)==0 ){
          static struct OpenMode aOpenMode[] = {
            { "ro",  SQLITE_OPEN_READONLY },
            { "rw",  SQLITE_OPEN_READWRITE },
            { "rwc", SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE },
            { "memory", SQLITE_OPEN_MEMORY },
            { 0, 0 }
          };

          mask = SQLITE_OPEN_READONLY | SQLITE_OPEN_READWRITE
                   | SQLITE_OPEN_CREATE | SQLITE_OPEN_MEMORY;
          aMode = aOpenMode;
          limit = mask & flags;
          zModeType = "access";
        }

        if( aMode ){
          int i;
          int mode = 0;
          for(i=0; aMode[i].z; i++){
            const char *z = aMode[i].z;
            if( nVal==sqlite3Strlen30(z) && 0==memcmp(zVal, z, nVal) ){
              mode = aMode[i].mode;
              break;
            }
          }
          if( mode==0 ){
            *pzErrMsg = sqlite3_mprintf("no such %s mode: %s", zModeType, zVal);
            rc = SQLITE_ERROR;
            goto parse_uri_out;
          }
          if( (mode & ~SQLITE_OPEN_MEMORY)>limit ){
            *pzErrMsg = sqlite3_mprintf("%s mode not allowed: %s",
                                        zModeType, zVal);
            rc = SQLITE_PERM;
            goto parse_uri_out;
          }
          flags = (flags & ~mask) | mode;
        }
      }

      zOpt = &zVal[nVal+1];
    }

  }else{
    zFile = sqlite3_malloc64(nUri+8);
    if( !zFile ) return SQLITE_NOMEM_BKPT;
    memset(zFile, 0, 4);
    zFile += 4;
    if( nUri ){
      memcpy(zFile, zUri, nUri);
    }
    memset(zFile+nUri, 0, 4);
    flags &= ~SQLITE_OPEN_URI;
  }

  *ppVfs = sqlite3_vfs_find(zVfs);
  if( *ppVfs==0 ){
    *pzErrMsg = sqlite3_mprintf("no such vfs: %s", zVfs);
    rc = SQLITE_ERROR;
  }
 parse_uri_out:
  if( rc!=SQLITE_OK ){
    sqlite3_free_filename(zFile);
    zFile = 0;
  }
  *pFlags = flags;
  *pzFile = zFile;
  return rc;
}